

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegionProfile.cpp
# Opt level: O0

region_profile_t * __thiscall
cali::RegionProfile::exclusive_region_times
          (region_profile_t *__return_storage_ptr__,RegionProfile *this,string *region_type)

{
  bool bVar1;
  char *region_attr_name;
  ChannelBody *chB;
  ostream *poVar2;
  __tuple_element_t<1UL,_tuple<map<basic_string<char>,_double,_less<basic_string<char>_>,_allocator<pair<const_basic_string<char>,_double>_>_>,_double,_double>_>
  *p_Var3;
  __tuple_element_t<2UL,_tuple<map<basic_string<char>,_double,_less<basic_string<char>_>,_allocator<pair<const_basic_string<char>,_double>_>_>,_double,_double>_>
  *p_Var4;
  __tuple_element_t<0UL,_tuple<map<basic_string<char>,_double,_less<basic_string<char>_>,_allocator<pair<const_basic_string<char>,_double>_>_>,_double,_double>_>
  *this_00;
  reference ppVar5;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
  *p;
  iterator __end1;
  iterator __begin1;
  __tuple_element_t<0UL,_tuple<map<basic_string<char>,_double,_less<basic_string<char>_>,_allocator<pair<const_basic_string<char>,_double>_>_>,_double,_double>_>
  *__range1;
  Log local_2a8;
  SnapshotFlushFn local_a0;
  SnapshotView local_80;
  undefined1 local_70 [8];
  FlatExclusiveRegionProfile rp;
  Channel chn;
  Caliper c;
  string *region_type_local;
  RegionProfile *this_local;
  tuple<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>,_double,_double>
  *res;
  
  Caliper::Caliper((Caliper *)
                   &chn.mP.super___shared_ptr<cali::ChannelBody,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
  ChannelController::channel((ChannelController *)&stack0xffffffffffffffb0);
  region_attr_name = (char *)std::__cxx11::string::c_str();
  FlatExclusiveRegionProfile::FlatExclusiveRegionProfile
            ((FlatExclusiveRegionProfile *)local_70,
             (CaliperMetadataAccessInterface *)
             &chn.mP.super___shared_ptr<cali::ChannelBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             "sum#time.duration.ns",region_attr_name);
  bVar1 = Channel::operator_cast_to_bool((Channel *)&stack0xffffffffffffffb0);
  if (bVar1) {
    chB = Channel::body((Channel *)&stack0xffffffffffffffb0);
    SnapshotView::SnapshotView(&local_80);
    std::
    function<void(cali::CaliperMetadataAccessInterface&,std::vector<cali::Entry,std::allocator<cali::Entry>>const&)>
    ::function<cali::FlatExclusiveRegionProfile&,void>
              ((function<void(cali::CaliperMetadataAccessInterface&,std::vector<cali::Entry,std::allocator<cali::Entry>>const&)>
                *)&local_a0,(FlatExclusiveRegionProfile *)local_70);
    Caliper::flush((Caliper *)
                   &chn.mP.super___shared_ptr<cali::ChannelBody,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount,chB,local_80,&local_a0);
    std::
    function<void_(cali::CaliperMetadataAccessInterface_&,_const_std::vector<cali::Entry,_std::allocator<cali::Entry>_>_&)>
    ::~function(&local_a0);
  }
  else {
    Log::Log(&local_2a8,1);
    poVar2 = Log::stream(&local_2a8);
    poVar2 = std::operator<<(poVar2,
                             "RegionProfile::exclusive_region_times(): channel is not enabled");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    Log::~Log(&local_2a8);
  }
  FlatExclusiveRegionProfile::result_abi_cxx11_
            (__return_storage_ptr__,(FlatExclusiveRegionProfile *)local_70);
  p_Var3 = std::
           get<1ul,std::map<std::__cxx11::string,double,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,double>>>,double,double>
                     (__return_storage_ptr__);
  *p_Var3 = *p_Var3 * 1e-09;
  p_Var4 = std::
           get<2ul,std::map<std::__cxx11::string,double,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,double>>>,double,double>
                     (__return_storage_ptr__);
  *p_Var4 = *p_Var4 * 1e-09;
  this_00 = std::
            get<0ul,std::map<std::__cxx11::string,double,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,double>>>,double,double>
                      (__return_storage_ptr__);
  __end1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
           ::begin(this_00);
  p = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
       *)std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
         ::end(this_00);
  while (bVar1 = std::operator!=(&__end1,(_Self *)&p), bVar1) {
    ppVar5 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>
             ::operator*(&__end1);
    ppVar5->second = ppVar5->second * 1e-09;
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>
    ::operator++(&__end1);
  }
  FlatExclusiveRegionProfile::~FlatExclusiveRegionProfile((FlatExclusiveRegionProfile *)local_70);
  Channel::~Channel((Channel *)&stack0xffffffffffffffb0);
  Caliper::~Caliper((Caliper *)
                    &chn.mP.super___shared_ptr<cali::ChannelBody,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount);
  return __return_storage_ptr__;
}

Assistant:

RegionProfile::region_profile_t RegionProfile::exclusive_region_times(const std::string& region_type)
{
    Caliper                    c;
    Channel                    chn = channel();
    FlatExclusiveRegionProfile rp(c, "sum#time.duration.ns", region_type.c_str());

    if (chn)
        c.flush(chn.body(), SnapshotView(), rp);
    else
        Log(1).stream() << "RegionProfile::exclusive_region_times(): channel is not enabled" << std::endl;

    auto res = rp.result();

    // convert from nanosec to sec
    std::get<1>(res) *= 1e-9;
    std::get<2>(res) *= 1e-9;
    for (auto& p : std::get<0>(res))
        p.second *= 1e-9;

    return res;
}